

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atf-c.c
# Opt level: O1

char * atf_tc_get_md_var(atf_tc_t *tc,char *key)

{
  atf_tc_impl_s_ *paVar1;
  size_t sVar2;
  int iVar3;
  size_t __n;
  size_t sVar4;
  
  __n = strlen(key);
  paVar1 = tc->impl_;
  sVar2 = paVar1->variables_size;
  if (sVar2 != 0) {
    sVar4 = 0;
    do {
      iVar3 = strncmp(paVar1->variables_key[sVar4],key,__n);
      if (iVar3 == 0) {
        return paVar1->variables_value[sVar4];
      }
      sVar4 = sVar4 + 1;
    } while (sVar2 != sVar4);
  }
  return (char *)0x0;
}

Assistant:

const char *
atf_tc_get_md_var(atf_tc_t const *tc, const char *key)
{
	size_t key_length = strlen(key);

	for (size_t i = 0; i < tc->impl_->variables_size; ++i) {
		if (strncmp(tc->impl_->variables_key[i], /**/
			key, key_length) == 0) {
			return tc->impl_->variables_value[i];
		}
	}

	return NULL;
}